

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-grammar-integration.cpp
# Opt level: O0

void test_grammar(string *test_desc,string *grammar_str,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *passing_strings,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *failing_strings)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000088;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000090;
  string *in_stack_00000098;
  string *in_stack_000000a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  string local_60 [16];
  char *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string local_40 [64];
  
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  test(in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

static void test_grammar(const std::string & test_desc, const std::string & grammar_str, const std::vector<std::string> & passing_strings, const std::vector<std::string> & failing_strings) {
    test(test_desc + ". Grammar: " + grammar_str, grammar_str, passing_strings, failing_strings);
}